

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Z80Implementation.hpp
# Opt level: O0

void __thiscall
CPU::Z80::ProcessorBase::set_interrupt_line(ProcessorBase *this,bool value,HalfCycles offset)

{
  bool bVar1;
  HalfCycles local_28;
  undefined1 local_19;
  ProcessorBase *pPStack_18;
  bool value_local;
  ProcessorBase *this_local;
  HalfCycles offset_local;
  
  if ((bool)((this->super_ProcessorStorage).irq_line_ & 1U) != value) {
    (this->super_ProcessorStorage).irq_line_ = value;
    if ((((this->super_ProcessorStorage).irq_line_ & 1U) == 0) ||
       (((this->super_ProcessorStorage).iff1_ & 1U) == 0)) {
      (this->super_ProcessorStorage).request_status_ =
           (this->super_ProcessorStorage).request_status_ & 0xfe;
    }
    else {
      (this->super_ProcessorStorage).request_status_ =
           (this->super_ProcessorStorage).request_status_ | 1;
    }
    local_19 = value;
    pPStack_18 = this;
    this_local = (ProcessorBase *)offset.super_WrappedInt<HalfCycles>.length_;
    HalfCycles::HalfCycles(&local_28,-2);
    bVar1 = WrappedInt<HalfCycles>::operator<=((WrappedInt<HalfCycles> *)&this_local,&local_28);
    if (bVar1) {
      (this->super_ProcessorStorage).last_request_status_ =
           (this->super_ProcessorStorage).last_request_status_ & 0xfe |
           (this->super_ProcessorStorage).request_status_ & 1;
    }
  }
  return;
}

Assistant:

void ProcessorBase::set_interrupt_line(bool value, HalfCycles offset) {
	if(irq_line_ == value) return;

	// IRQ requests are level triggered and masked.
	irq_line_ = value;
	if(irq_line_ && iff1_) {
		request_status_ |= Interrupt::IRQ;
	} else {
		request_status_ &= ~Interrupt::IRQ;
	}

	// If this change happened at least one cycle ago then: (i) we're promised that this is a machine
	// cycle per the contract on supplying an offset; and (ii) that means it happened before the lines
	// were sampled. So adjust the most recent sample.
	if(offset <= HalfCycles(-2)) {
		last_request_status_ = (last_request_status_ & ~Interrupt::IRQ) | (request_status_ & Interrupt::IRQ);
	}
}